

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O1

void __thiscall
RandomNumberUtil_GetRandomBytes4_Test::~RandomNumberUtil_GetRandomBytes4_Test
          (RandomNumberUtil_GetRandomBytes4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes4) {
  int size = 4;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}